

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

umap * units::getDefinedBaseUnitNames(void)

{
  const_iterator pvVar1;
  const_iterator pvVar2;
  unordered_map<units::unit,char_const*,std::hash<units::unit>,std::equal_to<units::unit>,std::allocator<std::pair<units::unit_const,char_const*>>>
  *in_RDI;
  value_type *name_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  array<std::pair<units::unit,_const_char_*>,_55UL> *__range1_1;
  value_type *name;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::pair<units::unit,_const_char_*>,_113UL> *__range1;
  umap *definedNames;
  
  memset(in_RDI,0,0x38);
  std::
  unordered_map<units::unit,_const_char_*,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_const_char_*>_>_>
  ::unordered_map((unordered_map<units::unit,_const_char_*,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_const_char_*>_>_>
                   *)in_RDI);
  __end1 = std::array<std::pair<units::unit,_const_char_*>,_113UL>::begin
                     ((array<std::pair<units::unit,_const_char_*>,_113UL> *)defined_unit_names_si);
  pvVar1 = std::array<std::pair<units::unit,_const_char_*>,_113UL>::end
                     ((array<std::pair<units::unit,_const_char_*>,_113UL> *)defined_unit_names_si);
  for (; __end1 != pvVar1; __end1 = __end1 + 1) {
    if (__end1->second != (char *)0x0) {
      std::
      unordered_map<units::unit,char_const*,std::hash<units::unit>,std::equal_to<units::unit>,std::allocator<std::pair<units::unit_const,char_const*>>>
      ::emplace<units::unit_const&,char_const*const&>(in_RDI,&__end1->first,&__end1->second);
    }
  }
  __end1_1 = std::array<std::pair<units::unit,_const_char_*>,_55UL>::begin
                       ((array<std::pair<units::unit,_const_char_*>,_55UL> *)
                        defined_unit_names_customary);
  pvVar2 = std::array<std::pair<units::unit,_const_char_*>,_55UL>::end
                     ((array<std::pair<units::unit,_const_char_*>,_55UL> *)
                      defined_unit_names_customary);
  for (; __end1_1 != pvVar2; __end1_1 = __end1_1 + 1) {
    if (__end1_1->second != (char *)0x0) {
      std::
      unordered_map<units::unit,char_const*,std::hash<units::unit>,std::equal_to<units::unit>,std::allocator<std::pair<units::unit_const,char_const*>>>
      ::emplace<units::unit_const&,char_const*const&>(in_RDI,&__end1_1->first,&__end1_1->second);
    }
  }
  return (umap *)in_RDI;
}

Assistant:

static umap getDefinedBaseUnitNames()
{
    umap definedNames{};
    for (const auto& name : defined_unit_names_si) {
        if (name.second != nullptr) {
            definedNames.emplace(name.first, name.second);
        }
    }
    for (const auto& name : defined_unit_names_customary) {
        if (name.second != nullptr) {
            definedNames.emplace(name.first, name.second);
        }
    }
    return definedNames;
}